

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

double expression(void)

{
  bool bVar1;
  double dVar2;
  Token local_88;
  undefined1 local_48 [8];
  Token t;
  double left;
  
  t.name.field_2._8_8_ = term();
  do {
    Token_stream::get((Token *)local_48,&ts);
    if (local_48[0] == '+') {
      dVar2 = term();
      t.name.field_2._8_8_ = (size_type)(dVar2 + t.name.field_2._8_8_);
LAB_00106f18:
      bVar1 = false;
    }
    else {
      if (local_48[0] == '-') {
        dVar2 = term();
        t.name.field_2._8_8_ = (size_type)(t.name.field_2._8_8_ - dVar2);
        goto LAB_00106f18;
      }
      Token::Token(&local_88,(Token *)local_48);
      Token_stream::unget(&ts,&local_88);
      Token::~Token(&local_88);
      left = (double)t.name.field_2._8_8_;
      bVar1 = true;
    }
    Token::~Token((Token *)local_48);
    if (bVar1) {
      return left;
    }
  } while( true );
}

Assistant:

double expression()
{
	double left = term();
	while (true)
	{
		Token t = ts.get();
		switch (t.kind) {
		case '+':
			left += term();
			break;
		case '-':
			left -= term();
			break;
		default:
			ts.unget(t);
			return left;
		}
	}
}